

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::UnitTest::AddTestPartResult
          (UnitTest *this,Type result_type,char *file_name,int line_number,String *message,
          String *os_stack_trace)

{
  bool bVar1;
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *pvVar2;
  size_type sVar3;
  Message *pMVar4;
  reference pvVar5;
  char *pcVar6;
  TestPartResultReporterInterface *pTVar7;
  GoogleTestFailureException *this_00;
  String *in_stack_fffffffffffffe90;
  String *in_stack_fffffffffffffe98;
  Message *in_stack_fffffffffffffea0;
  String local_d8;
  undefined1 local_c8 [8];
  TestPartResult result;
  TraceInfo *trace;
  int i;
  MutexLock lock;
  Message local_40;
  Message msg;
  String *os_stack_trace_local;
  String *message_local;
  int line_number_local;
  char *file_name_local;
  Type result_type_local;
  UnitTest *this_local;
  
  msg.ss_.ptr_ = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )os_stack_trace;
  Message::Message(in_stack_fffffffffffffea0);
  Message::operator<<(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  internal::GTestMutexLock::GTestMutexLock
            ((GTestMutexLock *)&stack0xffffffffffffffa8,&(this->mutex_).super_MutexBase);
  pvVar2 = internal::UnitTestImpl::gtest_trace_stack(this->impl_);
  sVar3 = std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::
          size(pvVar2);
  if (sVar3 != 0) {
    Message::operator<<(&local_40,(char (*) [2])0x193192);
    pMVar4 = Message::operator<<(in_stack_fffffffffffffea0,(char (*) [12])in_stack_fffffffffffffe98)
    ;
    Message::operator<<(pMVar4,(char (*) [8])" trace:");
    pvVar2 = internal::UnitTestImpl::gtest_trace_stack(this->impl_);
    sVar3 = std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
            ::size(pvVar2);
    for (trace._4_4_ = (int)sVar3; 0 < trace._4_4_; trace._4_4_ = trace._4_4_ + -1) {
      pvVar2 = internal::UnitTestImpl::gtest_trace_stack(this->impl_);
      pvVar5 = std::
               vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::
               operator[](pvVar2,(long)(trace._4_4_ + -1));
      pMVar4 = Message::operator<<(&local_40,(char (*) [2])0x193192);
      internal::FormatFileLocation_abi_cxx11_
                ((internal *)&result.message_.length_,pvVar5->file,pvVar5->line);
      pMVar4 = Message::operator<<(pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&result.message_.length_);
      Message::operator<<(pMVar4,(char (*) [2])0x193a2c);
      Message::operator<<(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      std::__cxx11::string::~string((string *)&result.message_.length_);
    }
  }
  pcVar6 = internal::String::c_str((String *)msg.ss_.ptr_);
  if ((pcVar6 != (char *)0x0) && (bVar1 = internal::String::empty((String *)msg.ss_.ptr_), !bVar1))
  {
    Message::operator<<(&local_40,(char (*) [15])"\nStack trace:\n");
    Message::operator<<(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  Message::GetString((Message *)in_stack_fffffffffffffe98);
  pcVar6 = internal::String::c_str(&local_d8);
  TestPartResult::TestPartResult
            ((TestPartResult *)local_c8,result_type,file_name,line_number,pcVar6);
  internal::String::~String(in_stack_fffffffffffffe90);
  pTVar7 = internal::UnitTestImpl::GetTestPartResultReporterForCurrentThread(this->impl_);
  (*pTVar7->_vptr_TestPartResultReporterInterface[2])(pTVar7,local_c8);
  if (result_type != kSuccess) {
    if ((FLAGS_gtest_break_on_failure & 1) == 0) {
      if ((FLAGS_gtest_throw_on_failure & 1) != 0) {
        this_00 = (GoogleTestFailureException *)__cxa_allocate_exception(0x10);
        GoogleTestFailureException::GoogleTestFailureException(this_00,(TestPartResult *)local_c8);
        __cxa_throw(this_00,&GoogleTestFailureException::typeinfo,
                    GoogleTestFailureException::~GoogleTestFailureException);
      }
    }
    else {
      uRam0000000000000000 = 1;
    }
  }
  TestPartResult::~TestPartResult((TestPartResult *)local_c8);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)&stack0xffffffffffffffa8);
  Message::~Message((Message *)0x160bc5);
  return;
}

Assistant:

void UnitTest::AddTestPartResult(TestPartResult::Type result_type,
                                 const char* file_name,
                                 int line_number,
                                 const internal::String& message,
                                 const internal::String& os_stack_trace) {
  Message msg;
  msg << message;

  internal::MutexLock lock(&mutex_);
  if (impl_->gtest_trace_stack().size() > 0) {
    msg << "\n" << GTEST_NAME_ << " trace:";

    for (int i = static_cast<int>(impl_->gtest_trace_stack().size());
         i > 0; --i) {
      const internal::TraceInfo& trace = impl_->gtest_trace_stack()[i - 1];
      msg << "\n" << internal::FormatFileLocation(trace.file, trace.line)
          << " " << trace.message;
    }
  }

  if (os_stack_trace.c_str() != NULL && !os_stack_trace.empty()) {
    msg << internal::kStackTraceMarker << os_stack_trace;
  }

  const TestPartResult result =
    TestPartResult(result_type, file_name, line_number,
                   msg.GetString().c_str());
  impl_->GetTestPartResultReporterForCurrentThread()->
      ReportTestPartResult(result);

  if (result_type != TestPartResult::kSuccess) {
    // gtest_break_on_failure takes precedence over
    // gtest_throw_on_failure.  This allows a user to set the latter
    // in the code (perhaps in order to use Google Test assertions
    // with another testing framework) and specify the former on the
    // command line for debugging.
    if (GTEST_FLAG(break_on_failure)) {
#if GTEST_OS_WINDOWS
      // Using DebugBreak on Windows allows gtest to still break into a debugger
      // when a failure happens and both the --gtest_break_on_failure and
      // the --gtest_catch_exceptions flags are specified.
      DebugBreak();
#else
      // Dereference NULL through a volatile pointer to prevent the compiler
      // from removing. We use this rather than abort() or __builtin_trap() for
      // portability: Symbian doesn't implement abort() well, and some debuggers
      // don't correctly trap abort().
      *static_cast<volatile int*>(NULL) = 1;
#endif  // GTEST_OS_WINDOWS
    } else if (GTEST_FLAG(throw_on_failure)) {
#if GTEST_HAS_EXCEPTIONS
      throw GoogleTestFailureException(result);
#else
      // We cannot call abort() as it generates a pop-up in debug mode
      // that cannot be suppressed in VC 7.1 or below.
      exit(1);
#endif
    }
  }
}